

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,float *p_scroll_v,
                       float size_avail_v,float size_contents_v,ImDrawCornerFlags rounding_corners)

{
  ImGuiWindow *pIVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  ImGuiContext *pIVar6;
  bool bVar7;
  ImU32 col;
  ImU32 col_00;
  undefined7 extraout_var;
  float *pfVar8;
  ImGuiCol idx;
  uint uVar9;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  float fVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  int iVar20;
  undefined1 auVar21 [12];
  int iVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar25;
  float fVar26;
  bool held;
  bool hovered;
  ImGuiAxis local_f0;
  float local_ec;
  ImRect local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ImDrawCornerFlags local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined1 local_78 [16];
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong local_58;
  undefined8 uStack_50;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    fVar25 = (bb_frame->Max).x - (bb_frame->Min).x;
    fVar26 = (bb_frame->Max).y - (bb_frame->Min).y;
    held = false;
    if ((0.0 < fVar25) && (0.0 < fVar26)) {
      local_ec = 1.0;
      if (axis == ImGuiAxis_Y) {
        fVar10 = (GImGui->Style).FramePadding.y;
        fVar10 = fVar10 + fVar10;
        if (fVar26 < fVar10 + GImGui->FontSize) {
          fVar10 = (fVar26 - GImGui->FontSize) / fVar10;
          if (fVar10 < 0.0) {
            return false;
          }
          local_ec = 1.0;
          if (fVar10 <= 1.0) {
            local_ec = fVar10;
          }
          if (local_ec <= 0.0) {
            return false;
          }
        }
      }
      iVar20 = (int)((fVar25 + -2.0) * 0.5);
      iVar24 = (int)((fVar26 + -2.0) * 0.5);
      auVar14._0_4_ = -(uint)(iVar20 < 0);
      auVar14._4_4_ = -(uint)(iVar24 < 0);
      auVar14._8_8_ = 0;
      auVar22._0_4_ = -(uint)(3 < iVar20);
      auVar22._4_4_ = -(uint)(3 < iVar24);
      auVar22._8_8_ = 0;
      auVar12._0_8_ = CONCAT44((float)iVar24,(float)iVar20) ^ 0x8000000080000000;
      auVar12._8_4_ = 0x80000000;
      auVar12._12_4_ = 0x80000000;
      auVar15 = auVar14 & _DAT_0024c3e0 | ~auVar14 & (auVar22 & _DAT_0024c3d0 | ~auVar22 & auVar12);
      fVar26 = auVar15._0_4_;
      fVar10 = auVar15._4_4_;
      auVar16._0_8_ = auVar15._0_8_;
      auVar16._8_4_ = fVar26;
      auVar16._12_4_ = fVar10;
      local_e8.Min.x = (bb_frame->Min).x;
      local_e8.Min.y = (bb_frame->Min).y;
      local_e8.Max.x = (bb_frame->Max).x;
      local_e8.Max.y = (bb_frame->Max).y;
      fVar25 = local_e8.Min.x - fVar26;
      fVar19 = local_e8.Min.y - fVar10;
      auVar5._4_4_ = local_e8.Max.x + fVar26;
      auVar5._0_4_ = local_e8.Min.y + fVar10;
      auVar13._12_4_ = local_e8.Max.y + fVar10;
      auVar5._8_4_ = auVar13._12_4_;
      auVar4._4_8_ = auVar16._8_8_;
      auVar4._0_4_ = local_e8.Min.y + fVar10;
      auVar17._0_8_ = auVar4._0_8_ << 0x20;
      auVar17._8_4_ = local_e8.Max.x + fVar26;
      auVar17._12_4_ = auVar13._12_4_;
      local_e8.Max = auVar17._8_8_;
      local_e8.Min.y = fVar19;
      local_e8.Min.x = fVar25;
      auVar15._8_8_ = auVar5._4_8_;
      if (axis == ImGuiAxis_X) {
        auVar15._0_8_ = auVar15._8_8_;
      }
      else {
        auVar13._4_4_ = auVar13._12_4_;
        auVar13._0_4_ = auVar13._12_4_;
        auVar13._8_4_ = auVar13._12_4_;
        auVar15 = auVar13;
        fVar25 = fVar19;
      }
      local_b8._4_12_ = auVar15._4_12_;
      local_b8._0_4_ = auVar15._0_4_ - fVar25;
      local_88 = (ImVec2 *)CONCAT44(in_XMM1_Db,size_contents_v);
      auVar18._0_4_ = -(uint)(size_avail_v <= size_contents_v) & (uint)size_contents_v;
      auVar18._4_4_ = in_XMM0_Db & in_XMM1_Db;
      auVar18._8_4_ = in_XMM0_Dc & in_XMM1_Dc;
      auVar18._12_4_ = in_XMM0_Dd & in_XMM1_Dd;
      local_a8 = ZEXT416(~-(uint)(size_avail_v <= size_contents_v) & (uint)size_avail_v) | auVar18;
      local_bc = rounding_corners;
      local_d8._0_4_ = size_avail_v;
      local_d8._4_4_ = in_XMM0_Db;
      uStack_d0._0_4_ = in_XMM0_Dc;
      uStack_d0._4_4_ = in_XMM0_Dd;
      if (local_a8._0_4_ <= 0.0) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                    ,900,"ScrollbarEx","ImGui ASSERT FAILED: %s",
                    "ImMax(size_contents_v, size_avail_v) > 0.0f");
      }
      if (local_a8._0_4_ <= 1.0) {
        local_a8._0_4_ = 0x3f800000;
      }
      fVar26 = local_b8._0_4_;
      fVar10 = ((float)local_d8 / local_a8._0_4_) * fVar26;
      fVar25 = (pIVar6->Style).GrabMinSize;
      if (fVar10 <= fVar26) {
        fVar26 = fVar10;
      }
      uVar9 = -(uint)(fVar10 < fVar25);
      local_a8._4_4_ = ~local_d8._4_4_ & local_b8._4_4_;
      local_a8._0_4_ = uVar9 & (uint)fVar25 | ~uVar9 & (uint)fVar26;
      local_a8._8_4_ = ~(uint)uStack_d0 & local_b8._8_4_;
      local_a8._12_4_ = ~uStack_d0._4_4_ & local_b8._12_4_;
      held = false;
      hovered = false;
      bVar7 = ButtonBehavior(&local_e8,id,&hovered,&held,0x4000);
      fVar25 = 1.0;
      if (1.0 <= (float)local_88 - (float)local_d8) {
        fVar25 = (float)local_88 - (float)local_d8;
      }
      auVar23._4_4_ = *p_scroll_v;
      auVar23._0_4_ = local_a8._0_4_;
      auVar23._8_4_ = local_a8._4_4_;
      auVar23._12_4_ = 0;
      auVar2._4_4_ = fVar25;
      auVar2._0_4_ = local_b8._0_4_;
      auVar2._8_4_ = local_b8._4_4_;
      auVar2._12_4_ = 0;
      auVar15 = divps(auVar23,auVar2);
      fVar10 = auVar15._4_4_;
      iVar20 = -(uint)(auVar15._0_4_ < 1.0);
      auVar3._4_4_ = iVar20;
      auVar3._0_4_ = iVar20;
      auVar3._8_4_ = -(uint)(fVar10 < 0.0);
      auVar3._12_4_ = -(uint)(fVar10 < 0.0);
      uVar9 = movmskpd((int)CONCAT71(extraout_var,bVar7),auVar3);
      fVar26 = 0.0;
      if (((uVar9 & 2) == 0) && (fVar26 = 1.0, fVar10 <= 1.0)) {
        fVar26 = fVar10;
      }
      local_88 = &bb_frame->Max;
      local_d8 = (ulong)(uint)((fVar26 * ((float)local_b8._0_4_ - (float)local_a8._0_4_)) /
                              (float)local_b8._0_4_);
      uStack_d0 = 0;
      if (((1.0 <= local_ec) && ((uVar9 & 1) != 0)) && (held != false)) {
        uStack_64 = local_b8._4_4_;
        uStack_60 = local_b8._8_4_;
        uStack_5c = local_b8._12_4_;
        local_58 = (ulong)(uint)fVar25;
        uStack_50 = 0;
        local_f0 = axis;
        local_78 = auVar15;
        local_68 = (float)local_b8._0_4_ - (float)local_a8._0_4_;
        pfVar8 = ImVec2::operator[](&local_e8.Min,(long)axis);
        local_98._0_4_ = *pfVar8;
        pfVar8 = ImVec2::operator[](&(pIVar6->IO).MousePos,(long)axis);
        fVar26 = (*pfVar8 - (float)local_98._0_4_) / (float)local_b8._0_4_;
        fVar25 = 1.0;
        if (fVar26 <= 1.0) {
          fVar25 = fVar26;
        }
        local_98 = ZEXT416(~-(uint)(fVar26 < 0.0) & (uint)fVar25);
        SetHoveredID(id);
        if (pIVar6->ActiveIdIsJustActivated == false) {
          fVar25 = pIVar6->ScrollbarClickDeltaToGrabCenter;
          bVar7 = false;
        }
        else if (((float)local_98._0_4_ < (float)local_d8) ||
                ((float)local_78._0_4_ + (float)local_d8 < (float)local_98._0_4_)) {
          pIVar6->ScrollbarClickDeltaToGrabCenter = 0.0;
          bVar7 = true;
          fVar25 = 0.0;
        }
        else {
          fVar25 = (float)local_78._0_4_ * -0.5 + ((float)local_98._0_4_ - (float)local_d8);
          pIVar6->ScrollbarClickDeltaToGrabCenter = fVar25;
          bVar7 = false;
        }
        auVar21 = ZEXT812(0x3f800000);
        fVar25 = (((float)local_98._0_4_ - fVar25) - (float)local_78._0_4_ * 0.5) /
                 (1.0 - (float)local_78._0_4_);
        auVar11 = ZEXT812(0x3f800000);
        if (fVar25 <= 1.0) {
          auVar11._4_8_ = auVar11._4_8_;
          auVar11._0_4_ = fVar25;
        }
        fVar25 = (float)(int)((float)(~-(uint)(fVar25 < 0.0) & auVar11._0_4_) * (float)local_58 +
                             0.5);
        *p_scroll_v = fVar25;
        fVar25 = fVar25 / (float)local_58;
        if (fVar25 <= auVar21._0_4_) {
          auVar21._4_8_ = auVar21._4_8_;
          auVar21._0_4_ = fVar25;
        }
        fVar25 = (local_68 * (float)(~-(uint)(fVar25 < 0.0) & auVar21._0_4_)) /
                 (float)local_b8._0_4_;
        local_d8 = CONCAT44(uStack_64,fVar25);
        uStack_d0 = CONCAT44(uStack_5c,uStack_60);
        axis = local_f0;
        if (bVar7) {
          pIVar6->ScrollbarClickDeltaToGrabCenter =
               -(float)local_78._0_4_ * 0.5 + ((float)local_98._0_4_ - fVar25);
        }
      }
      col = GetColorU32(0xe,1.0);
      idx = 0x11;
      if (held == false) {
        idx = (hovered & 1) + 0xf;
      }
      col_00 = GetColorU32(idx,local_ec);
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&bb_frame->Min,local_88,col,pIVar1->WindowRounding,local_bc);
      if (axis == ImGuiAxis_X) {
        local_40.x = local_e8.Min.x + (local_e8.Max.x - local_e8.Min.x) * (float)local_d8;
        local_38.x = (float)local_a8._0_4_ + local_40.x;
        local_40.y = local_e8.Min.y;
        local_38.y = local_e8.Max.y;
      }
      else {
        local_40.y = (local_e8.Max.y - local_e8.Min.y) * (float)local_d8 + local_e8.Min.y;
        local_40.x = local_e8.Min.x;
        local_38.x = local_e8.Max.x;
        local_38.y = (float)local_a8._0_4_ + local_40.y;
      }
      ImDrawList::AddRectFilled
                (pIVar1->DrawList,&local_40,&local_38,col_00,(pIVar6->Style).ScrollbarRounding,0xf);
    }
  }
  else {
    held = false;
  }
  return held;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, float* p_scroll_v, float size_avail_v, float size_contents_v, ImDrawCornerFlags rounding_corners)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = bb.Min[axis];
        float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = IM_ROUND(scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));

        // Update values for rendering
        scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, rounding_corners);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}